

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86_avx512::forward
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  undefined1 auVar3 [64];
  int *piVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  __m512 afVar16;
  undefined1 auVar17 [36];
  Option OVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  sbyte sVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  undefined1 auVar28 [8];
  undefined1 (*pauVar29) [16];
  char cVar30;
  int iVar31;
  int iVar32;
  undefined1 (*pauVar33) [64];
  undefined1 (*pauVar34) [32];
  size_t sVar35;
  float *pfVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  int unaff_R13D;
  float *outptr;
  undefined1 (*pauVar40) [64];
  undefined1 (*pauVar41) [32];
  long lVar42;
  int iVar43;
  undefined1 (*pauVar44) [64];
  undefined1 (*pauVar45) [32];
  bool bVar46;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  __m512 pad_value;
  Mat m_1;
  __m512 pad_value_2;
  undefined1 local_200 [8];
  undefined1 auStack_1f8 [8];
  undefined8 uStack_1f0;
  float fStack_1e8;
  float fStack_1e4;
  Allocator *pAStack_1e0;
  undefined1 auStack_1d8 [16];
  float fStack_1c8;
  float fStack_1c4;
  size_t local_1c0;
  undefined1 local_180 [16];
  undefined1 auStack_170 [24];
  undefined1 auStack_158 [16];
  int iStack_148;
  undefined4 uStack_144;
  size_t local_140;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  Option *local_f8;
  ulong local_f0;
  int local_e4;
  ulong local_e0;
  Mat *local_d8;
  ulong local_d0;
  Mat *local_c8;
  __m512 local_c0 [2];
  
  auVar52._0_4_ = (this->super_Padding).top;
  auVar52._4_4_ = (this->super_Padding).bottom;
  auVar52._8_4_ = (this->super_Padding).left;
  auVar52._12_4_ = (this->super_Padding).right;
  if (((auVar52 == (undefined1  [16])0x0) && ((this->super_Padding).front == 0)) &&
     ((this->super_Padding).behind == 0)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar4 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar4;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar19 = bottom_blob->w;
    iVar25 = bottom_blob->h;
    iVar20 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar19;
    top_blob->h = iVar25;
    top_blob->d = iVar20;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar19 = bottom_blob->elempack;
  if ((iVar19 != 0) && (((int)bottom_blob->elemsize << 3) / iVar19 == 8)) {
    iVar19 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar19;
  }
  local_108 = (ulong)(uint)bottom_blob->w;
  local_e0 = (ulong)(uint)bottom_blob->h;
  local_e4 = bottom_blob->d;
  local_110 = (ulong)(uint)bottom_blob->c;
  iVar25 = bottom_blob->dims;
  local_100 = bottom_blob->elemsize;
  local_f0 = CONCAT44(local_f0._4_4_,iVar25);
  local_f8 = opt;
  local_d8 = bottom_blob;
  if (iVar19 == 0x10) {
    if (iVar25 == 1) {
      auVar49 = vphaddd_avx(auVar52,auVar52);
      if ((auVar49 & (undefined1  [16])0xf00000000) == (undefined1  [16])0x0) {
        uVar37 = 0x10;
      }
      else if ((auVar49 & (undefined1  [16])0x700000000) == (undefined1  [16])0x0) {
        uVar37 = 8;
      }
      else {
        uVar37 = (ulong)((uint)((auVar49 & (undefined1  [16])0x300000000) == (undefined1  [16])0x0)
                         * 3 + 1);
      }
      bVar6 = (int)uVar37 == 0x10;
      bVar7 = (auVar52 & (undefined1  [16])0xf) == (undefined1  [16])0x0;
      bVar46 = (this->super_Padding).type == 0;
      if ((bVar6 && bVar7) && bVar46) {
        iVar20 = auVar49._4_4_ + bottom_blob->w * 0x10;
        iVar25 = iVar20 + 0xf;
        if (-1 < iVar20) {
          iVar25 = iVar20;
        }
        Mat::create(top_blob,iVar25 >> 4,uVar37 * (local_100 >> 4),0x10,opt->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          auVar47 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
          _local_200 = (__m512)vmovdqa64_avx512f(auVar47);
          iVar25 = (this->super_Padding).left;
          iVar20 = (this->super_Padding).right;
          iVar26 = iVar25 + 0xf;
          if (-1 < iVar25) {
            iVar26 = iVar25;
          }
          iVar25 = iVar20 + 0xf;
          if (-1 < iVar20) {
            iVar25 = iVar20;
          }
          unaff_R13D = 0;
          padding_constant_pack16_avx512
                    (bottom_blob,top_blob,0,0,iVar26 >> 4,iVar25 >> 4,(__m512 *)local_200);
        }
      }
      iVar25 = (int)local_f0;
      if ((bVar6 && bVar7) && bVar46) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 2) {
      uVar22 = (this->super_Padding).top;
      uVar21 = (int)local_e0 * 0x10 + uVar22 + (this->super_Padding).bottom;
      if ((uVar21 & 0xf) == 0) {
        uVar24 = 0x10;
      }
      else if ((uVar21 & 7) == 0) {
        uVar24 = 8;
      }
      else {
        uVar24 = (uint)((uVar21 & 3) == 0) * 3 + 1;
      }
      bVar6 = (uVar22 & 0xf) == 0;
      bVar46 = (this->super_Padding).type == 0;
      if ((uVar24 == 0x10 && bVar6) && bVar46) {
        uVar22 = uVar21 + 0xf;
        if (-1 < (int)uVar21) {
          uVar22 = uVar21;
        }
        Mat::create(top_blob,(this->super_Padding).left + (int)local_108 +
                             (this->super_Padding).right,(int)uVar22 >> 4,
                    (ulong)uVar24 * (local_100 >> 4),0x10,local_f8->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          auVar47 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
          _local_200 = (__m512)vmovdqa64_avx512f(auVar47);
          iVar25 = (this->super_Padding).top;
          iVar20 = (this->super_Padding).bottom;
          iVar26 = iVar25 + 0xf;
          if (-1 < iVar25) {
            iVar26 = iVar25;
          }
          iVar25 = iVar20 + 0xf;
          if (-1 < iVar20) {
            iVar25 = iVar20;
          }
          padding_constant_pack16_avx512
                    (bottom_blob,top_blob,iVar26 >> 4,iVar25 >> 4,(this->super_Padding).left,
                     (this->super_Padding).right,(__m512 *)local_200);
          unaff_R13D = 0;
        }
      }
      iVar25 = (int)local_f0;
      if ((uVar24 == 0x10 && bVar6) && bVar46) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 3) {
      uVar21 = (int)local_110 * 0x10;
      uVar22 = (this->super_Padding).front;
      uVar24 = uVar22 + uVar21 + (this->super_Padding).behind;
      if ((uVar24 & 0xf) == 0) {
        cVar30 = '\x10';
      }
      else if ((uVar24 & 7) == 0) {
        cVar30 = '\b';
      }
      else {
        cVar30 = ((uVar24 & 3) == 0) * '\x03' + '\x01';
      }
      bVar46 = true;
      if (((uVar22 & 0xf) == 0) && (cVar30 == '\x10')) {
        if ((uVar24 == uVar21) || ((this->super_Padding).type == 0)) {
          uVar22 = uVar24 + 0xf;
          if (-1 < (int)uVar24) {
            uVar22 = uVar24;
          }
          Mat::create(top_blob,(this->super_Padding).left + (int)local_108 +
                               (this->super_Padding).right,
                      (this->super_Padding).top + (int)local_e0 + (this->super_Padding).bottom,
                      (int)uVar22 >> 4,local_100 & 0xfffffffffffffff0,0x10,local_f8->blob_allocator)
          ;
          unaff_R13D = -100;
          if (top_blob->data == (void *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar25 = (this->super_Padding).front;
              iVar20 = iVar25 + 0xf;
              if (-1 < iVar25) {
                iVar20 = iVar25;
              }
              if (0xf < (int)uVar24) {
                local_d0 = (ulong)(uint)((int)uVar22 >> 4);
                uVar37 = 0;
                auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                do {
                  OVar18 = _local_180;
                  afVar16 = _local_200;
                  uVar39 = top_blob->elemsize;
                  pauVar40 = (undefined1 (*) [64])
                             (top_blob->cstep * uVar37 * uVar39 + (long)top_blob->data);
                  auStack_1f8._0_4_ = 0.0;
                  auStack_1f8._4_4_ = 0.0;
                  local_200 = (undefined1  [8])pauVar40;
                  uStack_1f0._0_4_ = (float)(int)uVar39;
                  uStack_1f0._4_4_ = (float)(int)(uVar39 >> 0x20);
                  _fStack_1e4 = afVar16._28_36_;
                  fStack_1e8 = (float)top_blob->elempack;
                  pAStack_1e0 = top_blob->allocator;
                  auStack_1d8._0_4_ = 3;
                  auStack_1d8._4_4_ = top_blob->w;
                  auStack_1d8._8_4_ = top_blob->h;
                  auStack_1d8._12_4_ = 1;
                  fStack_1c4 = afVar16[0xf];
                  fStack_1c8 = (float)top_blob->d;
                  uVar27 = (long)top_blob->h * (long)top_blob->w;
                  auStack_1d8._0_4_ = top_blob->dims + -1;
                  local_1c0 = (uVar39 * uVar27 + 0xf & 0xfffffffffffffff0) / uVar39;
                  if (top_blob->dims == 4) {
                    local_1c0 = uVar27;
                  }
                  if ((this->super_Padding).per_channel_pad_data_size == 0) {
                    auVar48 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
                  }
                  else {
                    auVar48 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                 ((long)(this->super_Padding).per_channel_pad_data.
                                                        data + uVar37 * 0x40));
                  }
                  local_c0[0] = (__m512)vmovdqa64_avx512f(auVar48);
                  uVar22 = (int)uVar37 - (iVar20 >> 4);
                  if ((int)uVar22 < 0 || (int)local_110 <= (int)uVar22) {
                    iVar25 = top_blob->d * (int)local_1c0;
                    if (0 < iVar25) {
                      do {
                        auVar3 = vmovdqu64_avx512f(auVar48);
                        *pauVar40 = auVar3;
                        pauVar40 = pauVar40 + 1;
                        iVar25 = iVar25 + -1;
                      } while (iVar25 != 0);
                    }
                  }
                  else {
                    iVar25 = bottom_blob->w;
                    uVar39 = bottom_blob->elemsize;
                    pauVar44 = (undefined1 (*) [64])
                               ((ulong)uVar22 * bottom_blob->cstep * uVar39 +
                               (long)bottom_blob->data);
                    local_180._8_8_ = 0;
                    local_180._0_8_ = pauVar44;
                    auStack_170._0_8_ = uVar39;
                    stack0xfffffffffffffe9c = OVar18._28_36_;
                    auStack_170._8_4_ = bottom_blob->elempack;
                    auStack_170._16_8_ = bottom_blob->allocator;
                    auStack_158._0_4_ = 3;
                    auStack_158[4] = (bool)(char)iVar25;
                    auStack_158[5] = (bool)(char)((uint)iVar25 >> 8);
                    auStack_158[6] = (bool)(char)((uint)iVar25 >> 0x10);
                    auStack_158[7] = (bool)(char)((uint)iVar25 >> 0x18);
                    auStack_158._8_4_ = bottom_blob->h;
                    auStack_158[0xc] = true;
                    auStack_158[0xd] = false;
                    auStack_158[0xe] = false;
                    auStack_158[0xf] = false;
                    uStack_144 = OVar18._60_4_;
                    iStack_148 = bottom_blob->d;
                    uVar27 = (long)bottom_blob->h * (long)iVar25;
                    auStack_158._0_4_ = bottom_blob->dims + -1;
                    local_140 = (uVar39 * uVar27 + 0xf & 0xfffffffffffffff0) / uVar39;
                    if (bottom_blob->dims == 4) {
                      local_140 = uVar27;
                    }
                    if ((this->super_Padding).type == 0) {
                      padding_constant_pack16_avx512
                                ((Mat *)local_180,(Mat *)local_200,(this->super_Padding).top,
                                 (this->super_Padding).bottom,(this->super_Padding).left,
                                 (this->super_Padding).right,local_c0);
                      auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar17 = stack0xfffffffffffffe9c;
                    if ((this->super_Padding).type == 1) {
                      iVar25 = (this->super_Padding).top;
                      iVar26 = (this->super_Padding).bottom;
                      iVar38 = (this->super_Padding).left;
                      iVar43 = (this->super_Padding).right;
                      if (0 < iVar25) {
                        iVar31 = 0;
                        do {
                          auVar48 = vmovdqa64_avx512f(*pauVar44);
                          iVar32 = iVar38;
                          if (0 < iVar38) {
                            do {
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar40 = pauVar40 + 1;
                              iVar32 = iVar32 + -1;
                            } while (iVar32 != 0);
                          }
                          if (0 < (int)auStack_158._4_4_) {
                            iVar32 = 0;
                            pauVar33 = pauVar44;
                            do {
                              auVar48 = vmovdqa64_avx512f(*pauVar33);
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar33 = pauVar33 + 1;
                              pauVar40 = pauVar40 + 1;
                              iVar32 = iVar32 + 1;
                            } while (iVar32 < (int)auStack_158._4_4_);
                          }
                          iVar32 = iVar43;
                          if (0 < iVar43) {
                            do {
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar40 = pauVar40 + 1;
                              iVar32 = iVar32 + -1;
                            } while (iVar32 != 0);
                          }
                          iVar31 = iVar31 + 1;
                        } while (iVar31 != iVar25);
                      }
                      if (0 < (int)auStack_158._8_4_) {
                        iVar25 = 0;
                        do {
                          auVar48 = vmovdqa64_avx512f(*pauVar44);
                          iVar31 = iVar38;
                          if (0 < iVar38) {
                            do {
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar40 = pauVar40 + 1;
                              iVar31 = iVar31 + -1;
                            } while (iVar31 != 0);
                          }
                          if (0 < (int)auStack_158._4_4_) {
                            iVar31 = 0;
                            do {
                              auVar48 = vmovdqa64_avx512f(*pauVar44);
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar44 = pauVar44 + 1;
                              pauVar40 = pauVar40 + 1;
                              iVar31 = iVar31 + 1;
                            } while (iVar31 < (int)auStack_158._4_4_);
                          }
                          iVar31 = iVar43;
                          if (0 < iVar43) {
                            do {
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar40 = pauVar40 + 1;
                              iVar31 = iVar31 + -1;
                            } while (iVar31 != 0);
                          }
                          iVar25 = iVar25 + 1;
                        } while (iVar25 < (int)auStack_158._8_4_);
                      }
                      if (0 < iVar26) {
                        iVar25 = 0;
                        do {
                          auVar48 = vmovdqa64_avx512f(pauVar44[-(long)(int)auStack_158._4_4_]);
                          iVar31 = iVar38;
                          if (0 < iVar38) {
                            do {
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar40 = pauVar40 + 1;
                              iVar31 = iVar31 + -1;
                            } while (iVar31 != 0);
                          }
                          if (0 < (int)auStack_158._4_4_) {
                            iVar31 = 0;
                            pauVar33 = pauVar44 + -(long)(int)auStack_158._4_4_;
                            do {
                              auVar48 = vmovdqa64_avx512f(*pauVar33);
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar33 = pauVar33 + 1;
                              pauVar40 = pauVar40 + 1;
                              iVar31 = iVar31 + 1;
                            } while (iVar31 < (int)auStack_158._4_4_);
                          }
                          iVar31 = iVar43;
                          if (0 < iVar43) {
                            do {
                              auVar3 = vmovdqa64_avx512f(auVar48);
                              *pauVar40 = auVar3;
                              pauVar40 = pauVar40 + 1;
                              iVar31 = iVar31 + -1;
                            } while (iVar31 != 0);
                          }
                          iVar25 = iVar25 + 1;
                        } while (iVar25 != iVar26);
                      }
                    }
                    if ((this->super_Padding).type == 2) {
                      iVar25 = (this->super_Padding).top;
                      iVar26 = (this->super_Padding).bottom;
                      uVar22 = (this->super_Padding).left;
                      uVar39 = (ulong)uVar22;
                      uVar21 = (this->super_Padding).right;
                      uVar27 = (ulong)uVar21;
                      pauVar40 = (undefined1 (*) [64])
                                 ((long)(auStack_158._4_4_ * iVar25 * 0x10) * 4 + local_180._0_8_);
                      auVar28 = local_200;
                      if (0 < iVar25) {
                        iVar38 = 0;
                        do {
                          lVar42 = uVar39 << 6;
                          if (0 < (int)uVar22) {
                            do {
                              auVar48 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar40 + lVar42)
                                                         );
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              lVar42 = lVar42 + -0x40;
                            } while (lVar42 != 0);
                          }
                          pauVar44 = pauVar40;
                          if (0 < (int)auStack_158._4_4_) {
                            iVar43 = 0;
                            do {
                              auVar48 = vmovdqa64_avx512f(*pauVar44);
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              pauVar44 = pauVar44 + 1;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              iVar43 = iVar43 + 1;
                            } while (iVar43 < (int)auStack_158._4_4_);
                          }
                          if (0 < (int)uVar21) {
                            lVar42 = -0x80;
                            do {
                              auVar48 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar44 + lVar42)
                                                         );
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              lVar1 = uVar27 * 0x40 + lVar42;
                              lVar42 = lVar42 + -0x40;
                            } while (lVar1 != -0x40);
                          }
                          pauVar40 = pauVar40 + -(long)(int)auStack_158._4_4_;
                          iVar38 = iVar38 + 1;
                          bottom_blob = local_d8;
                        } while (iVar38 != iVar25);
                      }
                      if (0 < (int)auStack_158._8_4_) {
                        iVar25 = 0;
                        do {
                          lVar42 = uVar39 << 6;
                          if (0 < (int)uVar22) {
                            do {
                              auVar48 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar40 + lVar42)
                                                         );
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              lVar42 = lVar42 + -0x40;
                            } while (lVar42 != 0);
                          }
                          if (0 < (int)auStack_158._4_4_) {
                            iVar38 = 0;
                            do {
                              auVar48 = vmovdqa64_avx512f(*pauVar40);
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              pauVar40 = pauVar40 + 1;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              iVar38 = iVar38 + 1;
                            } while (iVar38 < (int)auStack_158._4_4_);
                          }
                          if (0 < (int)uVar21) {
                            lVar42 = -0x80;
                            do {
                              auVar48 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar40 + lVar42)
                                                         );
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              lVar1 = uVar27 * 0x40 + lVar42;
                              lVar42 = lVar42 + -0x40;
                            } while (lVar1 != -0x40);
                          }
                          iVar25 = iVar25 + 1;
                        } while (iVar25 < (int)auStack_158._8_4_);
                      }
                      if (0 < iVar26) {
                        pauVar40 = pauVar40 + (long)(int)auStack_158._4_4_ * -2;
                        iVar25 = 0;
                        do {
                          lVar42 = uVar39 << 6;
                          if (0 < (int)uVar22) {
                            do {
                              auVar48 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar40 + lVar42)
                                                         );
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              lVar42 = lVar42 + -0x40;
                            } while (lVar42 != 0);
                          }
                          pauVar44 = pauVar40;
                          if (0 < (int)auStack_158._4_4_) {
                            iVar38 = 0;
                            do {
                              auVar48 = vmovdqa64_avx512f(*pauVar44);
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              pauVar44 = pauVar44 + 1;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              iVar38 = iVar38 + 1;
                            } while (iVar38 < (int)auStack_158._4_4_);
                          }
                          if (0 < (int)uVar21) {
                            lVar42 = -0x80;
                            do {
                              auVar48 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar44 + lVar42)
                                                         );
                              auVar48 = vmovdqa64_avx512f(auVar48);
                              *(undefined1 (*) [64])auVar28 = auVar48;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x40);
                              lVar1 = uVar27 * 0x40 + lVar42;
                              lVar42 = lVar42 + -0x40;
                            } while (lVar1 != -0x40);
                          }
                          pauVar40 = pauVar40 + -(long)(int)auStack_158._4_4_;
                          iVar25 = iVar25 + 1;
                        } while (iVar25 != iVar26);
                      }
                    }
                    unique0x10003fd1 = auVar17;
                    if ((Allocator *)local_180._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_180._8_8_ =
                           *(int *)(_func_int ***)local_180._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_180._8_8_ == 0) {
                        if ((Allocator *)auStack_170._16_8_ == (Allocator *)0x0) {
                          if ((void *)local_180._0_8_ != (void *)0x0) {
                            free((void *)local_180._0_8_);
                            auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                        }
                        else {
                          (*(*(_func_int ***)auStack_170._16_8_)[3])();
                          auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                      }
                    }
                    auVar17 = stack0xfffffffffffffe9c;
                    local_140 = 0;
                    auVar52 = auVar47._0_16_;
                    local_180._0_12_ = auVar47._0_12_;
                    stack0xfffffffffffffe8c = auVar52;
                    auStack_158._0_4_ = auVar52._0_4_;
                    auStack_158[4] = (bool)auVar52[4];
                    auStack_158[5] = (bool)auVar52[5];
                    auStack_158[6] = (bool)auVar52[6];
                    auStack_158[7] = (bool)auVar52[7];
                    auStack_158._8_4_ = auVar52._8_4_;
                    auStack_158[0xc] = (bool)auVar52[0xc];
                    auStack_158[0xd] = (bool)auVar52[0xd];
                    auStack_158[0xe] = (bool)auVar52[0xe];
                    auStack_158[0xf] = (bool)auVar52[0xf];
                    uStack_144 = auVar17._32_4_;
                    iStack_148._0_1_ = false;
                    iStack_148._1_1_ = false;
                    iStack_148._2_1_ = false;
                    iStack_148._3_1_ = false;
                  }
                  if (auStack_1f8 != (undefined1  [8])0x0) {
                    LOCK();
                    *(int *)auStack_1f8 = *(int *)auStack_1f8 + -1;
                    UNLOCK();
                    if (*(int *)auStack_1f8 == 0) {
                      if (pAStack_1e0 == (Allocator *)0x0) {
                        if (local_200 != (undefined1  [8])0x0) {
                          free((void *)local_200);
                          auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                      }
                      else {
                        (*pAStack_1e0->_vptr_Allocator[3])();
                        auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                    }
                  }
                  auVar17 = _fStack_1e4;
                  local_1c0 = 0;
                  auVar52 = auVar47._0_16_;
                  _local_200 = auVar47._0_12_;
                  auStack_1f8._4_4_ = auVar52._0_4_;
                  uStack_1f0._0_4_ = (float)auVar52._4_4_;
                  uStack_1f0._4_4_ = (float)auVar52._8_4_;
                  fStack_1e8 = (float)auVar52._12_4_;
                  auStack_1d8._0_4_ = auVar52._0_4_;
                  auStack_1d8._4_4_ = auVar52._4_4_;
                  auStack_1d8._8_4_ = auVar52._8_4_;
                  auStack_1d8._12_4_ = auVar52._12_4_;
                  fStack_1c4 = auVar17._32_4_;
                  fStack_1c8 = 0.0;
                  uVar37 = uVar37 + 1;
                } while (uVar37 != local_d0);
              }
              bVar46 = false;
              unaff_R13D = 0;
            }
          }
        }
      }
      iVar25 = (int)local_f0;
      if (!bVar46) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 4) {
      iVar20 = (this->super_Padding).type;
      if (iVar20 == 0) {
        uVar22 = (this->super_Padding).front + local_e4 + (this->super_Padding).behind;
        Mat::create(top_blob,(this->super_Padding).left + (int)local_108 +
                             (this->super_Padding).right,
                    (this->super_Padding).top + (int)local_e0 + (this->super_Padding).bottom,uVar22,
                    (int)local_110,local_100,0x10,local_f8->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)local_110 < 1) {
            unaff_R13D = 0;
          }
          else {
            local_d0 = local_d0 & 0xffffffff00000000;
            uVar37 = 0;
            local_c8 = top_blob;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                auVar47 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
              }
              else {
                auVar47 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                             ((long)(this->super_Padding).per_channel_pad_data.data
                                             + uVar37 * 0x40));
              }
              local_c0[0] = (__m512)vmovdqa64_avx512f(auVar47);
              if (0 < (int)uVar22) {
                uVar39 = 0;
                do {
                  OVar18 = _local_180;
                  afVar16 = _local_200;
                  sVar5 = top_blob->elemsize;
                  sVar35 = (long)top_blob->h * (long)top_blob->w;
                  pauVar40 = (undefined1 (*) [64])
                             ((long)top_blob->data +
                             uVar39 * sVar5 * sVar35 + top_blob->cstep * uVar37 * sVar5);
                  auStack_1f8._0_4_ = 0.0;
                  auStack_1f8._4_4_ = 0.0;
                  local_200 = (undefined1  [8])pauVar40;
                  uStack_1f0._0_4_ = (float)(int)sVar5;
                  uStack_1f0._4_4_ = (float)(int)(sVar5 >> 0x20);
                  _fStack_1e4 = afVar16._28_36_;
                  fStack_1e8 = (float)top_blob->elempack;
                  pAStack_1e0 = top_blob->allocator;
                  auStack_1d8._0_4_ = 2;
                  auStack_1d8._4_4_ = top_blob->w;
                  auStack_1d8._8_4_ = top_blob->h;
                  fStack_1c4 = afVar16[0xf];
                  auStack_1d8._12_4_ = 1.4013e-45;
                  fStack_1c8 = 1.4013e-45;
                  uVar21 = (int)uVar39 - (this->super_Padding).front;
                  if ((int)uVar21 < 0 || local_e4 <= (int)uVar21) {
                    local_1c0._0_4_ = (int)sVar35;
                    if (0 < (int)local_1c0) {
                      auVar47 = vmovdqa64_avx512f((undefined1  [64])local_c0[0]);
                      do {
                        auVar48 = vmovdqu64_avx512f(auVar47);
                        *pauVar40 = auVar48;
                        pauVar40 = pauVar40 + 1;
                        local_1c0._0_4_ = (int)local_1c0 + -1;
                      } while ((int)local_1c0 != 0);
                    }
                  }
                  else {
                    iVar25 = local_d8->w;
                    auStack_170._0_8_ = local_d8->elemsize;
                    local_140 = (long)local_d8->h * (long)iVar25;
                    local_180._8_8_ = 0;
                    local_180._0_8_ =
                         (long)local_d8->data +
                         (ulong)uVar21 * auStack_170._0_8_ * local_140 +
                         local_d8->cstep * uVar37 * auStack_170._0_8_;
                    stack0xfffffffffffffe9c = OVar18._28_36_;
                    auStack_170._8_4_ = local_d8->elempack;
                    auStack_170._16_8_ = local_d8->allocator;
                    auStack_158._0_4_ = 2;
                    auStack_158[4] = (bool)(char)iVar25;
                    auStack_158[5] = (bool)(char)((uint)iVar25 >> 8);
                    auStack_158[6] = (bool)(char)((uint)iVar25 >> 0x10);
                    auStack_158[7] = (bool)(char)((uint)iVar25 >> 0x18);
                    auStack_158._8_4_ = local_d8->h;
                    uStack_144 = OVar18._60_4_;
                    auStack_158[0xc] = true;
                    auStack_158[0xd] = false;
                    auStack_158[0xe] = false;
                    auStack_158[0xf] = false;
                    iStack_148._0_1_ = true;
                    iStack_148._1_1_ = false;
                    iStack_148._2_1_ = false;
                    iStack_148._3_1_ = false;
                    local_1c0 = sVar35;
                    padding_constant_pack16_avx512
                              ((Mat *)local_180,(Mat *)local_200,(this->super_Padding).top,
                               (this->super_Padding).bottom,(this->super_Padding).left,
                               (this->super_Padding).right,local_c0);
                    if ((Allocator *)local_180._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_180._8_8_ =
                           *(int *)(_func_int ***)local_180._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_180._8_8_ == 0) {
                        if ((Allocator *)auStack_170._16_8_ == (Allocator *)0x0) {
                          if ((void *)local_180._0_8_ != (void *)0x0) {
                            free((void *)local_180._0_8_);
                          }
                        }
                        else {
                          (*(*(_func_int ***)auStack_170._16_8_)[3])();
                        }
                      }
                    }
                    auVar17 = stack0xfffffffffffffe9c;
                    local_140 = 0;
                    local_180._0_12_ = SUB1612((undefined1  [16])0x0,0);
                    _local_180 = ZEXT1228(local_180._0_12_);
                    uStack_144 = auVar17._32_4_;
                    _local_180 = ZEXT4060(_local_180);
                    top_blob = local_c8;
                    sVar35 = local_1c0;
                  }
                  local_1c0 = sVar35;
                  if (auStack_1f8 != (undefined1  [8])0x0) {
                    LOCK();
                    *(int *)auStack_1f8 = *(int *)auStack_1f8 + -1;
                    UNLOCK();
                    if (*(int *)auStack_1f8 == 0) {
                      if (pAStack_1e0 == (Allocator *)0x0) {
                        if (local_200 != (undefined1  [8])0x0) {
                          free((void *)local_200);
                        }
                      }
                      else {
                        (*pAStack_1e0->_vptr_Allocator[3])();
                      }
                    }
                  }
                  auVar17 = _fStack_1e4;
                  local_1c0 = 0;
                  _local_200 = SUB1612((undefined1  [16])0x0,0);
                  _local_200 = ZEXT1228(_local_200);
                  fStack_1c4 = auVar17._32_4_;
                  _local_200 = ZEXT4060(_local_200);
                  uVar39 = uVar39 + 1;
                } while (uVar39 != uVar22);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != local_110);
            unaff_R13D = 0;
            bottom_blob = local_d8;
            iVar25 = (int)local_f0;
            iVar20 = (int)local_d0;
          }
        }
      }
      if (iVar20 == 0) {
        return unaff_R13D;
      }
    }
  }
  if (iVar19 == 8) {
    if (iVar25 == 1) {
      uVar22 = (this->super_Padding).left;
      uVar21 = uVar22 + (int)local_108 * 8 + (this->super_Padding).right;
      bVar46 = ((uVar22 | uVar21) & 7) == 0;
      bVar6 = (this->super_Padding).type == 0;
      if (bVar46 && bVar6) {
        uVar22 = uVar21 + 7;
        if (-1 < (int)uVar21) {
          uVar22 = uVar21;
        }
        Mat::create(top_blob,(int)uVar22 >> 3,local_100 & 0xfffffffffffffff8,8,
                    local_f8->blob_allocator);
        afVar16 = _local_200;
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          local_200._4_4_ = (this->super_Padding).value;
          local_200._0_4_ = local_200._4_4_;
          auStack_1f8._0_4_ = local_200._4_4_;
          auStack_1f8._4_4_ = local_200._4_4_;
          uStack_1f0._0_4_ = (float)local_200._4_4_;
          uStack_1f0._4_4_ = (float)local_200._4_4_;
          fStack_1e8 = (float)local_200._4_4_;
          _pAStack_1e0 = afVar16._32_32_;
          fStack_1e4 = (float)local_200._4_4_;
          iVar25 = (this->super_Padding).left;
          iVar20 = (this->super_Padding).right;
          iVar26 = iVar25 + 7;
          if (-1 < iVar25) {
            iVar26 = iVar25;
          }
          iVar25 = iVar20 + 7;
          if (-1 < iVar20) {
            iVar25 = iVar20;
          }
          unaff_R13D = 0;
          padding_constant_pack8_avx
                    (bottom_blob,top_blob,0,0,iVar26 >> 3,iVar25 >> 3,(__m256 *)local_200);
        }
      }
      iVar25 = (int)local_f0;
      if (bVar46 && bVar6) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 2) {
      uVar22 = (this->super_Padding).top;
      uVar21 = uVar22 + (int)local_e0 * 8 + (this->super_Padding).bottom;
      bVar46 = ((uVar22 | uVar21) & 7) == 0;
      bVar6 = (this->super_Padding).type == 0;
      if (bVar46 && bVar6) {
        uVar22 = uVar21 + 7;
        if (-1 < (int)uVar21) {
          uVar22 = uVar21;
        }
        Mat::create(top_blob,(this->super_Padding).left + (int)local_108 +
                             (this->super_Padding).right,(int)uVar22 >> 3,
                    local_100 & 0xfffffffffffffff8,8,local_f8->blob_allocator);
        afVar16 = _local_200;
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          local_200._4_4_ = (this->super_Padding).value;
          local_200._0_4_ = local_200._4_4_;
          auStack_1f8._0_4_ = local_200._4_4_;
          auStack_1f8._4_4_ = local_200._4_4_;
          uStack_1f0._0_4_ = (float)local_200._4_4_;
          uStack_1f0._4_4_ = (float)local_200._4_4_;
          fStack_1e8 = (float)local_200._4_4_;
          _pAStack_1e0 = afVar16._32_32_;
          fStack_1e4 = (float)local_200._4_4_;
          iVar25 = (this->super_Padding).top;
          iVar20 = (this->super_Padding).bottom;
          iVar26 = iVar25 + 7;
          if (-1 < iVar25) {
            iVar26 = iVar25;
          }
          iVar25 = iVar20 + 7;
          if (-1 < iVar20) {
            iVar25 = iVar20;
          }
          padding_constant_pack8_avx
                    (bottom_blob,top_blob,iVar26 >> 3,iVar25 >> 3,(this->super_Padding).left,
                     (this->super_Padding).right,(__m256 *)local_200);
          unaff_R13D = 0;
        }
      }
      iVar25 = (int)local_f0;
      if (bVar46 && bVar6) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 3) {
      uVar22 = (this->super_Padding).front;
      uVar21 = uVar22 + (int)local_110 * 8 + (this->super_Padding).behind;
      sVar23 = 3;
      if ((uVar21 & 7) != 0) {
        sVar23 = ((uVar21 & 3) == 0) * '\x02';
      }
      bVar46 = true;
      if (((uVar22 | uVar21) & 7) == 0) {
        if ((uVar21 == (int)local_110 * 8) || ((this->super_Padding).type == 0)) {
          uVar22 = uVar21 + 7;
          if (-1 < (int)uVar21) {
            uVar22 = uVar21;
          }
          Mat::create(top_blob,(this->super_Padding).left + (int)local_108 +
                               (this->super_Padding).right,
                      (this->super_Padding).top + (int)local_e0 + (this->super_Padding).bottom,
                      (int)uVar22 >> 3,(local_100 >> 3) << sVar23,8,local_f8->blob_allocator);
          unaff_R13D = -100;
          if (top_blob->data == (void *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar25 = (this->super_Padding).front;
              iVar20 = iVar25 + 7;
              if (-1 < iVar25) {
                iVar20 = iVar25;
              }
              if (7 < (int)uVar21) {
                local_d0 = (ulong)(uint)((int)uVar22 >> 3);
                uVar37 = 0;
                do {
                  OVar18 = _local_180;
                  afVar16 = _local_200;
                  uVar39 = top_blob->elemsize;
                  pauVar41 = (undefined1 (*) [32])
                             (top_blob->cstep * uVar37 * uVar39 + (long)top_blob->data);
                  auStack_1f8._0_4_ = 0.0;
                  auStack_1f8._4_4_ = 0.0;
                  local_200 = (undefined1  [8])pauVar41;
                  uStack_1f0._0_4_ = (float)(int)uVar39;
                  uStack_1f0._4_4_ = (float)(int)(uVar39 >> 0x20);
                  _fStack_1e4 = afVar16._28_36_;
                  fStack_1e8 = (float)top_blob->elempack;
                  pAStack_1e0 = top_blob->allocator;
                  auStack_1d8._0_4_ = 3;
                  auStack_1d8._4_4_ = top_blob->w;
                  auStack_1d8._8_4_ = top_blob->h;
                  auStack_1d8._12_4_ = 1;
                  fStack_1c4 = afVar16[0xf];
                  fStack_1c8 = (float)top_blob->d;
                  uVar27 = (long)top_blob->h * (long)top_blob->w;
                  auStack_1d8._0_4_ = top_blob->dims + -1;
                  local_1c0 = (uVar39 * uVar27 + 0xf & 0xfffffffffffffff0) / uVar39;
                  if (top_blob->dims == 4) {
                    local_1c0 = uVar27;
                  }
                  if ((this->super_Padding).per_channel_pad_data_size == 0) {
                    fVar2 = (this->super_Padding).value;
                    auVar51._4_4_ = fVar2;
                    auVar51._0_4_ = fVar2;
                    auVar51._8_4_ = fVar2;
                    auVar51._12_4_ = fVar2;
                    auVar51._16_4_ = fVar2;
                    auVar51._20_4_ = fVar2;
                    auVar51._24_4_ = fVar2;
                    auVar51._28_4_ = fVar2;
                  }
                  else {
                    auVar51 = *(undefined1 (*) [32])
                               ((long)(this->super_Padding).per_channel_pad_data.data +
                               uVar37 * 0x20);
                  }
                  local_c0[0][0] = (float)auVar51._0_4_;
                  local_c0[0][1] = (float)auVar51._4_4_;
                  local_c0[0][2] = (float)auVar51._8_4_;
                  local_c0[0][3] = (float)auVar51._12_4_;
                  local_c0[0][4] = (float)auVar51._16_4_;
                  local_c0[0][5] = (float)auVar51._20_4_;
                  local_c0[0][6] = (float)auVar51._24_4_;
                  local_c0[0][7] = (float)auVar51._28_4_;
                  uVar22 = (int)uVar37 - (iVar20 >> 3);
                  if ((int)uVar22 < 0 || (int)local_110 <= (int)uVar22) {
                    iVar25 = top_blob->d * (int)local_1c0;
                    if (0 < iVar25) {
                      do {
                        *pauVar41 = auVar51;
                        pauVar41 = pauVar41 + 1;
                        iVar25 = iVar25 + -1;
                      } while (iVar25 != 0);
                    }
                  }
                  else {
                    iVar25 = bottom_blob->w;
                    uVar39 = bottom_blob->elemsize;
                    pauVar45 = (undefined1 (*) [32])
                               ((ulong)uVar22 * bottom_blob->cstep * uVar39 +
                               (long)bottom_blob->data);
                    local_180._8_8_ = 0;
                    local_180._0_8_ = pauVar45;
                    auStack_170._0_8_ = uVar39;
                    stack0xfffffffffffffe9c = OVar18._28_36_;
                    auStack_170._8_4_ = bottom_blob->elempack;
                    auStack_170._16_8_ = bottom_blob->allocator;
                    auStack_158._0_4_ = 3;
                    auStack_158[4] = (bool)(char)iVar25;
                    auStack_158[5] = (bool)(char)((uint)iVar25 >> 8);
                    auStack_158[6] = (bool)(char)((uint)iVar25 >> 0x10);
                    auStack_158[7] = (bool)(char)((uint)iVar25 >> 0x18);
                    auStack_158._8_4_ = bottom_blob->h;
                    auStack_158[0xc] = true;
                    auStack_158[0xd] = false;
                    auStack_158[0xe] = false;
                    auStack_158[0xf] = false;
                    uStack_144 = OVar18._60_4_;
                    iStack_148 = bottom_blob->d;
                    uVar27 = (long)bottom_blob->h * (long)iVar25;
                    auStack_158._0_4_ = bottom_blob->dims + -1;
                    local_140 = (uVar39 * uVar27 + 0xf & 0xfffffffffffffff0) / uVar39;
                    if (bottom_blob->dims == 4) {
                      local_140 = uVar27;
                    }
                    if ((this->super_Padding).type == 0) {
                      padding_constant_pack8_avx
                                ((Mat *)local_180,(Mat *)local_200,(this->super_Padding).top,
                                 (this->super_Padding).bottom,(this->super_Padding).left,
                                 (this->super_Padding).right,(__m256 *)local_c0);
                    }
                    auVar17 = stack0xfffffffffffffe9c;
                    if ((this->super_Padding).type == 1) {
                      iVar25 = (this->super_Padding).top;
                      iVar26 = (this->super_Padding).bottom;
                      iVar38 = (this->super_Padding).left;
                      iVar43 = (this->super_Padding).right;
                      if (0 < iVar25) {
                        iVar31 = 0;
                        do {
                          auVar51 = *pauVar45;
                          iVar32 = iVar38;
                          if (0 < iVar38) {
                            do {
                              *pauVar41 = auVar51;
                              pauVar41 = pauVar41 + 1;
                              iVar32 = iVar32 + -1;
                            } while (iVar32 != 0);
                          }
                          if (0 < (int)auStack_158._4_4_) {
                            iVar32 = 0;
                            pauVar34 = pauVar45;
                            do {
                              auVar51 = *pauVar34;
                              *pauVar41 = auVar51;
                              pauVar34 = pauVar34 + 1;
                              pauVar41 = pauVar41 + 1;
                              iVar32 = iVar32 + 1;
                            } while (iVar32 < (int)auStack_158._4_4_);
                          }
                          iVar32 = iVar43;
                          if (0 < iVar43) {
                            do {
                              *pauVar41 = auVar51;
                              pauVar41 = pauVar41 + 1;
                              iVar32 = iVar32 + -1;
                            } while (iVar32 != 0);
                          }
                          iVar31 = iVar31 + 1;
                        } while (iVar31 != iVar25);
                      }
                      if (0 < (int)auStack_158._8_4_) {
                        iVar25 = 0;
                        do {
                          auVar51 = *pauVar45;
                          iVar31 = iVar38;
                          if (0 < iVar38) {
                            do {
                              *pauVar41 = auVar51;
                              pauVar41 = pauVar41 + 1;
                              iVar31 = iVar31 + -1;
                            } while (iVar31 != 0);
                          }
                          if (0 < (int)auStack_158._4_4_) {
                            iVar31 = 0;
                            do {
                              auVar51 = *pauVar45;
                              *pauVar41 = auVar51;
                              pauVar45 = pauVar45 + 1;
                              pauVar41 = pauVar41 + 1;
                              iVar31 = iVar31 + 1;
                            } while (iVar31 < (int)auStack_158._4_4_);
                          }
                          iVar31 = iVar43;
                          if (0 < iVar43) {
                            do {
                              *pauVar41 = auVar51;
                              pauVar41 = pauVar41 + 1;
                              iVar31 = iVar31 + -1;
                            } while (iVar31 != 0);
                          }
                          iVar25 = iVar25 + 1;
                        } while (iVar25 < (int)auStack_158._8_4_);
                      }
                      if (0 < iVar26) {
                        iVar25 = 0;
                        do {
                          auVar51 = pauVar45[-(long)(int)auStack_158._4_4_];
                          iVar31 = iVar38;
                          if (0 < iVar38) {
                            do {
                              *pauVar41 = auVar51;
                              pauVar41 = pauVar41 + 1;
                              iVar31 = iVar31 + -1;
                            } while (iVar31 != 0);
                          }
                          if (0 < (int)auStack_158._4_4_) {
                            iVar31 = 0;
                            pauVar34 = pauVar45 + -(long)(int)auStack_158._4_4_;
                            do {
                              auVar51 = *pauVar34;
                              *pauVar41 = auVar51;
                              pauVar34 = pauVar34 + 1;
                              pauVar41 = pauVar41 + 1;
                              iVar31 = iVar31 + 1;
                            } while (iVar31 < (int)auStack_158._4_4_);
                          }
                          iVar31 = iVar43;
                          if (0 < iVar43) {
                            do {
                              *pauVar41 = auVar51;
                              pauVar41 = pauVar41 + 1;
                              iVar31 = iVar31 + -1;
                            } while (iVar31 != 0);
                          }
                          iVar25 = iVar25 + 1;
                        } while (iVar25 != iVar26);
                      }
                    }
                    if ((this->super_Padding).type == 2) {
                      iVar25 = (this->super_Padding).top;
                      iVar26 = (this->super_Padding).bottom;
                      uVar22 = (this->super_Padding).left;
                      uVar39 = (ulong)uVar22;
                      uVar21 = (this->super_Padding).right;
                      uVar27 = (ulong)uVar21;
                      pauVar41 = (undefined1 (*) [32])
                                 ((long)(auStack_158._4_4_ * iVar25 * 8) * 4 + local_180._0_8_);
                      auVar28 = local_200;
                      if (0 < iVar25) {
                        iVar38 = 0;
                        do {
                          lVar42 = uVar39 << 5;
                          if (0 < (int)uVar22) {
                            do {
                              *(undefined1 (*) [32])auVar28 =
                                   *(undefined1 (*) [32])(*pauVar41 + lVar42);
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              lVar42 = lVar42 + -0x20;
                            } while (lVar42 != 0);
                          }
                          pauVar45 = pauVar41;
                          if (0 < (int)auStack_158._4_4_) {
                            iVar43 = 0;
                            do {
                              *(undefined1 (*) [32])auVar28 = *pauVar45;
                              pauVar45 = pauVar45 + 1;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              iVar43 = iVar43 + 1;
                            } while (iVar43 < (int)auStack_158._4_4_);
                          }
                          if (0 < (int)uVar21) {
                            lVar42 = -0x40;
                            do {
                              *(undefined1 (*) [32])auVar28 =
                                   *(undefined1 (*) [32])(*pauVar45 + lVar42);
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              lVar1 = uVar27 * 0x20 + lVar42;
                              lVar42 = lVar42 + -0x20;
                            } while (lVar1 != -0x20);
                          }
                          pauVar41 = pauVar41 + -(long)(int)auStack_158._4_4_;
                          iVar38 = iVar38 + 1;
                          bottom_blob = local_d8;
                        } while (iVar38 != iVar25);
                      }
                      if (0 < (int)auStack_158._8_4_) {
                        iVar25 = 0;
                        do {
                          lVar42 = uVar39 << 5;
                          if (0 < (int)uVar22) {
                            do {
                              *(undefined1 (*) [32])auVar28 =
                                   *(undefined1 (*) [32])(*pauVar41 + lVar42);
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              lVar42 = lVar42 + -0x20;
                            } while (lVar42 != 0);
                          }
                          if (0 < (int)auStack_158._4_4_) {
                            iVar38 = 0;
                            do {
                              *(undefined1 (*) [32])auVar28 = *pauVar41;
                              pauVar41 = pauVar41 + 1;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              iVar38 = iVar38 + 1;
                            } while (iVar38 < (int)auStack_158._4_4_);
                          }
                          if (0 < (int)uVar21) {
                            lVar42 = -0x40;
                            do {
                              *(undefined1 (*) [32])auVar28 =
                                   *(undefined1 (*) [32])(*pauVar41 + lVar42);
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              lVar1 = uVar27 * 0x20 + lVar42;
                              lVar42 = lVar42 + -0x20;
                            } while (lVar1 != -0x20);
                          }
                          iVar25 = iVar25 + 1;
                        } while (iVar25 < (int)auStack_158._8_4_);
                      }
                      if (0 < iVar26) {
                        pauVar41 = pauVar41 + (long)(int)auStack_158._4_4_ * -2;
                        iVar25 = 0;
                        do {
                          lVar42 = uVar39 << 5;
                          if (0 < (int)uVar22) {
                            do {
                              *(undefined1 (*) [32])auVar28 =
                                   *(undefined1 (*) [32])(*pauVar41 + lVar42);
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              lVar42 = lVar42 + -0x20;
                            } while (lVar42 != 0);
                          }
                          pauVar45 = pauVar41;
                          if (0 < (int)auStack_158._4_4_) {
                            iVar38 = 0;
                            do {
                              *(undefined1 (*) [32])auVar28 = *pauVar45;
                              pauVar45 = pauVar45 + 1;
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              iVar38 = iVar38 + 1;
                            } while (iVar38 < (int)auStack_158._4_4_);
                          }
                          if (0 < (int)uVar21) {
                            lVar42 = -0x40;
                            do {
                              *(undefined1 (*) [32])auVar28 =
                                   *(undefined1 (*) [32])(*pauVar45 + lVar42);
                              auVar28 = (undefined1  [8])((long)auVar28 + 0x20);
                              lVar1 = uVar27 * 0x20 + lVar42;
                              lVar42 = lVar42 + -0x20;
                            } while (lVar1 != -0x20);
                          }
                          pauVar41 = pauVar41 + -(long)(int)auStack_158._4_4_;
                          iVar25 = iVar25 + 1;
                        } while (iVar25 != iVar26);
                      }
                    }
                    unique0x10004211 = auVar17;
                    if ((Allocator *)local_180._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_180._8_8_ =
                           *(int *)(_func_int ***)local_180._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_180._8_8_ == 0) {
                        if ((Allocator *)auStack_170._16_8_ == (Allocator *)0x0) {
                          if ((void *)local_180._0_8_ != (void *)0x0) {
                            free((void *)local_180._0_8_);
                          }
                        }
                        else {
                          (*(*(_func_int ***)auStack_170._16_8_)[3])();
                        }
                      }
                    }
                    auVar17 = stack0xfffffffffffffe9c;
                    local_140 = 0;
                    local_180 = ZEXT816(0);
                    _local_180 = ZEXT1228(local_180._0_12_);
                    uStack_144 = auVar17._32_4_;
                    _local_180 = ZEXT4060(_local_180);
                  }
                  if (auStack_1f8 != (undefined1  [8])0x0) {
                    LOCK();
                    *(int *)auStack_1f8 = *(int *)auStack_1f8 + -1;
                    UNLOCK();
                    if (*(int *)auStack_1f8 == 0) {
                      if (pAStack_1e0 == (Allocator *)0x0) {
                        if (local_200 != (undefined1  [8])0x0) {
                          free((void *)local_200);
                        }
                      }
                      else {
                        (*pAStack_1e0->_vptr_Allocator[3])();
                      }
                    }
                  }
                  auVar17 = _fStack_1e4;
                  local_1c0 = 0;
                  _local_200 = (__m128)ZEXT816(0);
                  _local_200 = ZEXT1228(_local_200);
                  fStack_1c4 = auVar17._32_4_;
                  _local_200 = ZEXT4060(_local_200);
                  uVar37 = uVar37 + 1;
                } while (uVar37 != local_d0);
              }
              bVar46 = false;
              unaff_R13D = 0;
            }
          }
        }
      }
      iVar25 = (int)local_f0;
      if (!bVar46) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 4) {
      iVar20 = (this->super_Padding).type;
      if (iVar20 == 0) {
        uVar22 = (this->super_Padding).front + local_e4 + (this->super_Padding).behind;
        Mat::create(top_blob,(this->super_Padding).left + (int)local_108 +
                             (this->super_Padding).right,
                    (this->super_Padding).top + (int)local_e0 + (this->super_Padding).bottom,uVar22,
                    (int)local_110,local_100,8,local_f8->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)local_110 < 1) {
            unaff_R13D = 0;
          }
          else {
            local_d0 = local_d0 & 0xffffffff00000000;
            uVar37 = 0;
            local_c8 = top_blob;
            do {
              afVar16 = local_c0[0];
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                local_c0[0][0] = (this->super_Padding).value;
                local_c0[0][1] = local_c0[0][0];
                local_c0[0][2] = local_c0[0][0];
                local_c0[0][3] = local_c0[0][0];
                local_c0[0][4] = local_c0[0][0];
                local_c0[0][5] = local_c0[0][0];
                local_c0[0][6] = local_c0[0][0];
                local_c0[0][7] = local_c0[0][0];
              }
              else {
                pfVar36 = (float *)((long)(this->super_Padding).per_channel_pad_data.data +
                                   uVar37 * 0x20);
                local_c0[0][0] = *pfVar36;
                local_c0[0][1] = pfVar36[1];
                local_c0[0][2] = pfVar36[2];
                local_c0[0][3] = pfVar36[3];
                local_c0[0][4] = pfVar36[4];
                local_c0[0][5] = pfVar36[5];
                local_c0[0][6] = pfVar36[6];
                local_c0[0][7] = pfVar36[7];
              }
              local_c0[0]._32_32_ = afVar16._32_32_;
              if (0 < (int)uVar22) {
                uVar39 = 0;
                do {
                  OVar18 = _local_180;
                  afVar16 = _local_200;
                  sVar5 = top_blob->elemsize;
                  sVar35 = (long)top_blob->h * (long)top_blob->w;
                  pfVar36 = (float *)((long)top_blob->data +
                                     uVar39 * sVar5 * sVar35 + top_blob->cstep * uVar37 * sVar5);
                  auStack_1f8._0_4_ = 0.0;
                  auStack_1f8._4_4_ = 0.0;
                  local_200 = (undefined1  [8])pfVar36;
                  uStack_1f0._0_4_ = (float)(int)sVar5;
                  uStack_1f0._4_4_ = (float)(int)(sVar5 >> 0x20);
                  _fStack_1e4 = afVar16._28_36_;
                  fStack_1e8 = (float)top_blob->elempack;
                  pAStack_1e0 = top_blob->allocator;
                  auStack_1d8._0_4_ = 2;
                  auStack_1d8._4_4_ = top_blob->w;
                  auStack_1d8._8_4_ = top_blob->h;
                  fStack_1c4 = afVar16[0xf];
                  auStack_1d8._12_4_ = 1.4013e-45;
                  fStack_1c8 = 1.4013e-45;
                  uVar21 = (int)uVar39 - (this->super_Padding).front;
                  if ((int)uVar21 < 0 || local_e4 <= (int)uVar21) {
                    local_1c0._0_4_ = (int)sVar35;
                    if (0 < (int)local_1c0) {
                      do {
                        *(undefined8 *)pfVar36 = local_c0[0]._0_8_;
                        *(undefined8 *)(pfVar36 + 2) = local_c0[0]._8_8_;
                        *(undefined8 *)(pfVar36 + 4) = local_c0[0]._16_8_;
                        *(undefined8 *)(pfVar36 + 6) = local_c0[0]._24_8_;
                        pfVar36 = pfVar36 + 8;
                        local_1c0._0_4_ = (int)local_1c0 + -1;
                      } while ((int)local_1c0 != 0);
                    }
                  }
                  else {
                    iVar25 = local_d8->w;
                    auStack_170._0_8_ = local_d8->elemsize;
                    local_140 = (long)local_d8->h * (long)iVar25;
                    local_180._8_8_ = 0;
                    local_180._0_8_ =
                         (long)local_d8->data +
                         (ulong)uVar21 * auStack_170._0_8_ * local_140 +
                         local_d8->cstep * uVar37 * auStack_170._0_8_;
                    stack0xfffffffffffffe9c = OVar18._28_36_;
                    auStack_170._8_4_ = local_d8->elempack;
                    auStack_170._16_8_ = local_d8->allocator;
                    auStack_158._0_4_ = 2;
                    auStack_158[4] = (bool)(char)iVar25;
                    auStack_158[5] = (bool)(char)((uint)iVar25 >> 8);
                    auStack_158[6] = (bool)(char)((uint)iVar25 >> 0x10);
                    auStack_158[7] = (bool)(char)((uint)iVar25 >> 0x18);
                    auStack_158._8_4_ = local_d8->h;
                    uStack_144 = OVar18._60_4_;
                    auStack_158[0xc] = true;
                    auStack_158[0xd] = false;
                    auStack_158[0xe] = false;
                    auStack_158[0xf] = false;
                    iStack_148._0_1_ = true;
                    iStack_148._1_1_ = false;
                    iStack_148._2_1_ = false;
                    iStack_148._3_1_ = false;
                    local_1c0 = sVar35;
                    padding_constant_pack8_avx
                              ((Mat *)local_180,(Mat *)local_200,(this->super_Padding).top,
                               (this->super_Padding).bottom,(this->super_Padding).left,
                               (this->super_Padding).right,(__m256 *)local_c0);
                    if ((Allocator *)local_180._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_180._8_8_ =
                           *(int *)(_func_int ***)local_180._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_180._8_8_ == 0) {
                        if ((Allocator *)auStack_170._16_8_ == (Allocator *)0x0) {
                          if ((void *)local_180._0_8_ != (void *)0x0) {
                            free((void *)local_180._0_8_);
                          }
                        }
                        else {
                          (*(*(_func_int ***)auStack_170._16_8_)[3])();
                        }
                      }
                    }
                    auVar17 = stack0xfffffffffffffe9c;
                    local_140 = 0;
                    local_180._0_12_ = SUB1612((undefined1  [16])0x0,0);
                    _local_180 = ZEXT1228(local_180._0_12_);
                    uStack_144 = auVar17._32_4_;
                    _local_180 = ZEXT4060(_local_180);
                    top_blob = local_c8;
                    sVar35 = local_1c0;
                  }
                  local_1c0 = sVar35;
                  if (auStack_1f8 != (undefined1  [8])0x0) {
                    LOCK();
                    *(int *)auStack_1f8 = *(int *)auStack_1f8 + -1;
                    UNLOCK();
                    if (*(int *)auStack_1f8 == 0) {
                      if (pAStack_1e0 == (Allocator *)0x0) {
                        if (local_200 != (undefined1  [8])0x0) {
                          free((void *)local_200);
                        }
                      }
                      else {
                        (*pAStack_1e0->_vptr_Allocator[3])();
                      }
                    }
                  }
                  auVar17 = _fStack_1e4;
                  local_1c0 = 0;
                  _local_200 = SUB1612((undefined1  [16])0x0,0);
                  _local_200 = ZEXT1228(_local_200);
                  fStack_1c4 = auVar17._32_4_;
                  _local_200 = ZEXT4060(_local_200);
                  uVar39 = uVar39 + 1;
                } while (uVar39 != uVar22);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != local_110);
            unaff_R13D = 0;
            bottom_blob = local_d8;
            iVar25 = (int)local_f0;
            iVar20 = (int)local_d0;
          }
        }
      }
      if (iVar20 == 0) {
        return unaff_R13D;
      }
    }
  }
  if (iVar19 == 4) {
    if (iVar25 == 1) {
      uVar22 = (this->super_Padding).left;
      uVar21 = (this->super_Padding).right;
      uVar24 = uVar22 + (int)local_108 * 4 + uVar21;
      bVar6 = (uVar24 & 7) == 4;
      bVar7 = (uVar22 & 3) == 0;
      bVar46 = (this->super_Padding).type == 0;
      if ((bVar6 && bVar7) && bVar46) {
        Mat::create(top_blob,(int)uVar24 >> 2,(local_100 >> 2) << ((uVar21 & 3) == 0) * '\x02',4,
                    local_f8->blob_allocator);
        afVar16 = _local_200;
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) &&
           (unaff_R13D = -100, (long)top_blob->c * top_blob->cstep != 0)) {
          local_200._4_4_ = (this->super_Padding).value;
          local_200._0_4_ = local_200._4_4_;
          auStack_1f8._0_4_ = local_200._4_4_;
          _uStack_1f0 = afVar16._16_48_;
          auStack_1f8._4_4_ = local_200._4_4_;
          iVar25 = (this->super_Padding).left;
          iVar20 = (this->super_Padding).right;
          iVar26 = iVar25 + 3;
          if (-1 < iVar25) {
            iVar26 = iVar25;
          }
          iVar25 = iVar20 + 3;
          if (-1 < iVar20) {
            iVar25 = iVar20;
          }
          unaff_R13D = 0;
          padding_constant_pack4_sse
                    (bottom_blob,top_blob,0,0,iVar26 >> 2,iVar25 >> 2,(__m128 *)local_200);
        }
      }
      iVar25 = (int)local_f0;
      if ((bVar6 && bVar7) && bVar46) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 2) {
      uVar22 = (this->super_Padding).top;
      uVar21 = (this->super_Padding).bottom;
      uVar24 = uVar22 + (int)local_e0 * 4 + uVar21;
      bVar6 = (uVar24 & 7) == 4;
      bVar7 = (uVar22 & 3) == 0;
      bVar46 = (this->super_Padding).type == 0;
      if ((bVar6 && bVar7) && bVar46) {
        Mat::create(top_blob,(this->super_Padding).left + (int)local_108 +
                             (this->super_Padding).right,(int)uVar24 >> 2,
                    (local_100 >> 2) << ((uVar21 & 3) == 0) * '\x02',4,local_f8->blob_allocator);
        afVar16 = _local_200;
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          local_200._4_4_ = (this->super_Padding).value;
          local_200._0_4_ = local_200._4_4_;
          auStack_1f8._0_4_ = local_200._4_4_;
          _uStack_1f0 = afVar16._16_48_;
          auStack_1f8._4_4_ = local_200._4_4_;
          iVar25 = (this->super_Padding).top;
          iVar20 = (this->super_Padding).bottom;
          iVar26 = iVar25 + 3;
          if (-1 < iVar25) {
            iVar26 = iVar25;
          }
          iVar25 = iVar20 + 3;
          if (-1 < iVar20) {
            iVar25 = iVar20;
          }
          padding_constant_pack4_sse
                    (bottom_blob,top_blob,iVar26 >> 2,iVar25 >> 2,(this->super_Padding).left,
                     (this->super_Padding).right,(__m128 *)local_200);
          unaff_R13D = 0;
        }
      }
      iVar25 = (int)local_f0;
      if ((bVar6 && bVar7) && bVar46) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 3) {
      uVar22 = (this->super_Padding).front;
      uVar21 = uVar22 + (int)local_110 * 4 + (this->super_Padding).behind;
      sVar23 = 3;
      if ((uVar21 & 7) != 0) {
        sVar23 = ((uVar21 & 3) == 0) * '\x02';
      }
      bVar46 = true;
      if (((uVar22 & 3) == 0) && ((uVar21 & 7) == 4)) {
        if ((uVar21 == (int)local_110 * 4) || ((this->super_Padding).type == 0)) {
          uVar21 = (int)uVar21 >> 2;
          Mat::create(top_blob,(this->super_Padding).left + (int)local_108 +
                               (this->super_Padding).right,
                      (this->super_Padding).top + (int)local_e0 + (this->super_Padding).bottom,
                      uVar21,(local_100 >> 2) << sVar23,4,local_f8->blob_allocator);
          unaff_R13D = -100;
          if (top_blob->data == (void *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar20 = (this->super_Padding).front;
              iVar26 = iVar20 + 3;
              if (-1 < iVar20) {
                iVar26 = iVar20;
              }
              if (0 < (int)uVar21) {
                local_f0 = (ulong)uVar21;
                uVar37 = 0;
                do {
                  OVar18 = _local_180;
                  afVar16 = _local_200;
                  uVar39 = top_blob->elemsize;
                  pauVar29 = (undefined1 (*) [16])
                             (top_blob->cstep * uVar37 * uVar39 + (long)top_blob->data);
                  auStack_1f8._0_4_ = 0.0;
                  auStack_1f8._4_4_ = 0.0;
                  local_200 = (undefined1  [8])pauVar29;
                  uStack_1f0._0_4_ = (float)(int)uVar39;
                  uStack_1f0._4_4_ = (float)(int)(uVar39 >> 0x20);
                  _fStack_1e4 = afVar16._28_36_;
                  fStack_1e8 = (float)top_blob->elempack;
                  pAStack_1e0 = top_blob->allocator;
                  auStack_1d8._0_4_ = 3;
                  auStack_1d8._4_4_ = top_blob->w;
                  auStack_1d8._8_4_ = top_blob->h;
                  auStack_1d8._12_4_ = 1;
                  fStack_1c4 = afVar16[0xf];
                  fStack_1c8 = (float)top_blob->d;
                  uVar27 = (long)top_blob->h * (long)top_blob->w;
                  auStack_1d8._0_4_ = top_blob->dims + -1;
                  local_1c0 = (uVar39 * uVar27 + 0xf & 0xfffffffffffffff0) / uVar39;
                  if (top_blob->dims == 4) {
                    local_1c0 = uVar27;
                  }
                  if ((this->super_Padding).per_channel_pad_data_size == 0) {
                    fVar2 = (this->super_Padding).value;
                    auVar49._4_4_ = fVar2;
                    auVar49._0_4_ = fVar2;
                    auVar49._8_4_ = fVar2;
                    auVar49._12_4_ = fVar2;
                  }
                  else {
                    auVar49 = *(undefined1 (*) [16])
                               ((long)(this->super_Padding).per_channel_pad_data.data +
                               uVar37 * 0x10);
                  }
                  local_c0[0][0] = (float)auVar49._0_4_;
                  local_c0[0][1] = (float)auVar49._4_4_;
                  local_c0[0][2] = (float)auVar49._8_4_;
                  local_c0[0][3] = (float)auVar49._12_4_;
                  uVar22 = (int)uVar37 - (iVar26 >> 2);
                  if ((int)uVar22 < 0 || (int)local_110 <= (int)uVar22) {
                    iVar20 = top_blob->d * (int)local_1c0;
                    if (0 < iVar20) {
                      do {
                        *pauVar29 = auVar49;
                        pauVar29 = pauVar29 + 1;
                        iVar20 = iVar20 + -1;
                      } while (iVar20 != 0);
                    }
                  }
                  else {
                    iVar20 = bottom_blob->w;
                    uVar39 = bottom_blob->elemsize;
                    local_180._8_8_ = 0;
                    local_180._0_8_ =
                         (void *)((ulong)uVar22 * bottom_blob->cstep * uVar39 +
                                 (long)bottom_blob->data);
                    auStack_170._0_8_ = uVar39;
                    stack0xfffffffffffffe9c = OVar18._28_36_;
                    auStack_170._8_4_ = bottom_blob->elempack;
                    auStack_170._16_8_ = bottom_blob->allocator;
                    auStack_158._0_4_ = 3;
                    auStack_158[4] = (bool)(char)iVar20;
                    auStack_158[5] = (bool)(char)((uint)iVar20 >> 8);
                    auStack_158[6] = (bool)(char)((uint)iVar20 >> 0x10);
                    auStack_158[7] = (bool)(char)((uint)iVar20 >> 0x18);
                    auStack_158._8_4_ = bottom_blob->h;
                    auStack_158[0xc] = true;
                    auStack_158[0xd] = false;
                    auStack_158[0xe] = false;
                    auStack_158[0xf] = false;
                    uStack_144 = OVar18._60_4_;
                    iStack_148 = bottom_blob->d;
                    uVar27 = (long)bottom_blob->h * (long)iVar20;
                    auStack_158._0_4_ = bottom_blob->dims + -1;
                    local_140 = (uVar39 * uVar27 + 0xf & 0xfffffffffffffff0) / uVar39;
                    if (bottom_blob->dims == 4) {
                      local_140 = uVar27;
                    }
                    if ((this->super_Padding).type == 0) {
                      padding_constant_pack4_sse
                                ((Mat *)local_180,(Mat *)local_200,(this->super_Padding).top,
                                 (this->super_Padding).bottom,(this->super_Padding).left,
                                 (this->super_Padding).right,(__m128 *)local_c0);
                    }
                    if ((this->super_Padding).type == 1) {
                      padding_replicate_pack4_sse
                                ((Mat *)local_180,(Mat *)local_200,(this->super_Padding).top,
                                 (this->super_Padding).bottom,(this->super_Padding).left,
                                 (this->super_Padding).right);
                    }
                    if ((this->super_Padding).type == 2) {
                      padding_reflect_pack4_sse
                                ((Mat *)local_180,(Mat *)local_200,(this->super_Padding).top,
                                 (this->super_Padding).bottom,(this->super_Padding).left,
                                 (this->super_Padding).right);
                    }
                    auVar17 = stack0xfffffffffffffe9c;
                    local_140 = 0;
                    local_180._0_12_ = SUB1612((undefined1  [16])0x0,0);
                    _local_180 = ZEXT1228(local_180._0_12_);
                    uStack_144 = auVar17._32_4_;
                    _local_180 = ZEXT4060(_local_180);
                  }
                  if (auStack_1f8 != (undefined1  [8])0x0) {
                    LOCK();
                    *(int *)auStack_1f8 = *(int *)auStack_1f8 + -1;
                    UNLOCK();
                    if (*(int *)auStack_1f8 == 0) {
                      if (pAStack_1e0 == (Allocator *)0x0) {
                        if (local_200 != (undefined1  [8])0x0) {
                          free((void *)local_200);
                        }
                      }
                      else {
                        (*pAStack_1e0->_vptr_Allocator[3])();
                      }
                    }
                  }
                  auVar17 = _fStack_1e4;
                  local_1c0 = 0;
                  _local_200 = SUB1612((undefined1  [16])0x0,0);
                  _local_200 = ZEXT1228(_local_200);
                  fStack_1c4 = auVar17._32_4_;
                  _local_200 = ZEXT4060(_local_200);
                  uVar37 = uVar37 + 1;
                } while (uVar37 != local_f0);
              }
              bVar46 = false;
              unaff_R13D = 0;
            }
          }
        }
      }
      if (!bVar46) {
        return unaff_R13D;
      }
    }
    if (iVar25 == 4) {
      iVar25 = (this->super_Padding).type;
      if (iVar25 == 0) {
        iVar20 = (this->super_Padding).front + local_e4 + (this->super_Padding).behind;
        iVar26 = (int)local_108;
        local_108 = CONCAT44(local_108._4_4_,iVar20);
        Mat::create(top_blob,iVar26 + (this->super_Padding).left + (this->super_Padding).right,
                    (int)local_e0 + (this->super_Padding).top + (this->super_Padding).bottom,iVar20,
                    (int)local_110,local_100,4,local_f8->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)local_110 < 1) {
            unaff_R13D = 0;
          }
          else {
            local_100 = local_100 & 0xffffffff00000000;
            uVar37 = local_108 & 0xffffffff;
            uVar39 = 0;
            local_f0 = uVar37;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar2 = (this->super_Padding).value;
                auVar50._4_4_ = fVar2;
                auVar50._0_4_ = fVar2;
                auVar50._8_4_ = fVar2;
                auVar50._12_4_ = fVar2;
              }
              else {
                auVar50 = *(undefined1 (*) [16])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar39 * 0x10);
              }
              local_c0[0][0] = (float)auVar50._0_4_;
              local_c0[0][1] = (float)auVar50._4_4_;
              local_c0[0][2] = (float)auVar50._8_4_;
              local_c0[0][3] = (float)auVar50._12_4_;
              if (0 < (int)local_108) {
                uVar27 = 0;
                do {
                  OVar18 = _local_180;
                  afVar16 = _local_200;
                  sVar5 = top_blob->elemsize;
                  sVar35 = (long)top_blob->h * (long)top_blob->w;
                  pfVar36 = (float *)((long)top_blob->data +
                                     uVar27 * sVar5 * sVar35 + top_blob->cstep * uVar39 * sVar5);
                  auStack_1f8._0_4_ = 0.0;
                  auStack_1f8._4_4_ = 0.0;
                  local_200 = (undefined1  [8])pfVar36;
                  uStack_1f0._0_4_ = (float)(int)sVar5;
                  uStack_1f0._4_4_ = (float)(int)(sVar5 >> 0x20);
                  _fStack_1e4 = afVar16._28_36_;
                  fStack_1e8 = (float)top_blob->elempack;
                  pAStack_1e0 = top_blob->allocator;
                  auStack_1d8._0_4_ = 2;
                  auStack_1d8._4_4_ = top_blob->w;
                  auStack_1d8._8_4_ = top_blob->h;
                  fStack_1c4 = afVar16[0xf];
                  auStack_1d8._12_4_ = 1.4013e-45;
                  fStack_1c8 = 1.4013e-45;
                  uVar22 = (int)uVar27 - (this->super_Padding).front;
                  if ((int)uVar22 < 0 || local_e4 <= (int)uVar22) {
                    local_1c0._0_4_ = (int)sVar35;
                    if (0 < (int)local_1c0) {
                      do {
                        *(undefined8 *)pfVar36 = local_c0[0]._0_8_;
                        *(undefined8 *)(pfVar36 + 2) = local_c0[0]._8_8_;
                        pfVar36 = pfVar36 + 4;
                        local_1c0._0_4_ = (int)local_1c0 + -1;
                      } while ((int)local_1c0 != 0);
                    }
                  }
                  else {
                    iVar25 = local_d8->w;
                    auStack_170._0_8_ = local_d8->elemsize;
                    local_140 = (long)local_d8->h * (long)iVar25;
                    local_180._8_8_ = 0;
                    local_180._0_8_ =
                         (long)local_d8->data +
                         (ulong)uVar22 * auStack_170._0_8_ * local_140 +
                         local_d8->cstep * uVar39 * auStack_170._0_8_;
                    stack0xfffffffffffffe9c = OVar18._28_36_;
                    auStack_170._8_4_ = local_d8->elempack;
                    auStack_170._16_8_ = local_d8->allocator;
                    auStack_158._0_4_ = 2;
                    auStack_158[4] = (bool)(char)iVar25;
                    auStack_158[5] = (bool)(char)((uint)iVar25 >> 8);
                    auStack_158[6] = (bool)(char)((uint)iVar25 >> 0x10);
                    auStack_158[7] = (bool)(char)((uint)iVar25 >> 0x18);
                    auStack_158._8_4_ = local_d8->h;
                    uStack_144 = OVar18._60_4_;
                    auStack_158[0xc] = true;
                    auStack_158[0xd] = false;
                    auStack_158[0xe] = false;
                    auStack_158[0xf] = false;
                    iStack_148._0_1_ = true;
                    iStack_148._1_1_ = false;
                    iStack_148._2_1_ = false;
                    iStack_148._3_1_ = false;
                    local_1c0 = sVar35;
                    padding_constant_pack4_sse
                              ((Mat *)local_180,(Mat *)local_200,(this->super_Padding).top,
                               (this->super_Padding).bottom,(this->super_Padding).left,
                               (this->super_Padding).right,(__m128 *)local_c0);
                    if ((Allocator *)local_180._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_180._8_8_ =
                           *(int *)(_func_int ***)local_180._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_180._8_8_ == 0) {
                        if ((Allocator *)auStack_170._16_8_ == (Allocator *)0x0) {
                          if ((void *)local_180._0_8_ != (void *)0x0) {
                            free((void *)local_180._0_8_);
                          }
                        }
                        else {
                          (*(*(_func_int ***)auStack_170._16_8_)[3])();
                        }
                      }
                    }
                    auVar17 = stack0xfffffffffffffe9c;
                    local_140 = 0;
                    local_180._0_12_ = SUB1612((undefined1  [16])0x0,0);
                    _local_180 = ZEXT1228(local_180._0_12_);
                    uStack_144 = auVar17._32_4_;
                    _local_180 = ZEXT4060(_local_180);
                    uVar37 = local_f0;
                    sVar35 = local_1c0;
                  }
                  local_1c0 = sVar35;
                  if (auStack_1f8 != (undefined1  [8])0x0) {
                    LOCK();
                    *(int *)auStack_1f8 = *(int *)auStack_1f8 + -1;
                    UNLOCK();
                    if (*(int *)auStack_1f8 == 0) {
                      if (pAStack_1e0 == (Allocator *)0x0) {
                        if (local_200 != (undefined1  [8])0x0) {
                          free((void *)local_200);
                        }
                      }
                      else {
                        (*pAStack_1e0->_vptr_Allocator[3])();
                      }
                    }
                  }
                  auVar17 = _fStack_1e4;
                  _local_200 = SUB1612((undefined1  [16])0x0,0);
                  _local_200 = ZEXT1228(_local_200);
                  fStack_1c4 = auVar17._32_4_;
                  _local_200 = ZEXT4060(_local_200);
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar37);
              }
              uVar39 = uVar39 + 1;
            } while (uVar39 != local_110);
            unaff_R13D = 0;
            bottom_blob = local_d8;
            iVar25 = (int)local_100;
          }
        }
      }
      if (iVar25 == 0) {
        return unaff_R13D;
      }
    }
  }
  auVar17 = _fStack_1e4;
  piVar4 = bottom_blob->refcount;
  uVar12 = bottom_blob->data;
  uVar13 = bottom_blob->refcount;
  uVar14 = bottom_blob->elemsize;
  uVar15 = bottom_blob->elempack;
  fStack_1e8 = (float)uVar15;
  uStack_1f0 = uVar14;
  auStack_1f8 = (undefined1  [8])uVar13;
  local_200 = (undefined1  [8])uVar12;
  pAStack_1e0 = bottom_blob->allocator;
  uVar8 = bottom_blob->dims;
  uVar9 = bottom_blob->w;
  auStack_1d8._4_4_ = uVar9;
  auStack_1d8._0_4_ = uVar8;
  uVar10 = bottom_blob->h;
  uVar11 = bottom_blob->d;
  auStack_1d8._12_4_ = uVar11;
  auStack_1d8._8_4_ = uVar10;
  fStack_1c4 = auVar17._32_4_;
  fStack_1c8 = (float)bottom_blob->c;
  local_1c0 = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (iVar19 != 1) {
    auVar47 = vmovdqu64_avx512f((undefined1  [64])*local_f8);
    auVar47 = vmovdqa64_avx512f(auVar47);
    _auStack_170 = auVar47._16_48_;
    local_180._0_8_ = auVar47._0_8_;
    local_180._8_8_ = local_f8->workspace_allocator;
    convert_packing(bottom_blob,(Mat *)local_200,1,(Option *)local_180);
    if (local_200 == (undefined1  [8])0x0) {
      bVar46 = true;
    }
    else {
      bVar46 = (long)(int)fStack_1c8 * local_1c0 == 0;
    }
    if (bVar46) {
      iVar19 = -100;
      goto LAB_00438ac0;
    }
  }
  iVar19 = Padding::forward(&this->super_Padding,(Mat *)local_200,top_blob,local_f8);
LAB_00438ac0:
  if (auStack_1f8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)auStack_1f8 = *(int *)auStack_1f8 + -1;
    UNLOCK();
    if (*(int *)auStack_1f8 == 0) {
      if (pAStack_1e0 == (Allocator *)0x0) {
        if (local_200 != (undefined1  [8])0x0) {
          free((void *)local_200);
        }
      }
      else {
        (*pAStack_1e0->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int Padding_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}